

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_service.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::ServiceGenerator::GenerateInterface
          (ServiceGenerator *this,Printer *printer)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables;
  
  variables = &this->vars_;
  io::Printer::Print(printer,variables,
                     "class $dllexport$$classname$ : public ::google::protobuf::Service {\n protected:\n  // This class should be treated as an abstract interface.\n  inline $classname$() {};\n public:\n  virtual ~$classname$();\n"
                    );
  io::Printer::Indent(printer);
  io::Printer::Print(printer,variables,
                     "\ntypedef $classname$_Stub Stub;\n\nstatic const ::google::protobuf::ServiceDescriptor* descriptor();\n\n"
                    );
  GenerateMethodSignatures(this,VIRTUAL,printer);
  io::Printer::Print(printer,
                     "\n// implements Service ----------------------------------------------\n\nconst ::google::protobuf::ServiceDescriptor* GetDescriptor();\nvoid CallMethod(const ::google::protobuf::MethodDescriptor* method,\n                ::google::protobuf::RpcController* controller,\n                const ::google::protobuf::Message* request,\n                ::google::protobuf::Message* response,\n                ::google::protobuf::Closure* done);\nconst ::google::protobuf::Message& GetRequestPrototype(\n  const ::google::protobuf::MethodDescriptor* method) const;\nconst ::google::protobuf::Message& GetResponsePrototype(\n  const ::google::protobuf::MethodDescriptor* method) const;\n"
                    );
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,variables,
                     "\n private:\n  GOOGLE_DISALLOW_EVIL_CONSTRUCTORS($classname$);\n};\n\n");
  return;
}

Assistant:

void ServiceGenerator::GenerateInterface(io::Printer* printer) {
  printer->Print(vars_,
    "class $dllexport$$classname$ : public ::google::protobuf::Service {\n"
    " protected:\n"
    "  // This class should be treated as an abstract interface.\n"
    "  inline $classname$() {};\n"
    " public:\n"
    "  virtual ~$classname$();\n");
  printer->Indent();

  printer->Print(vars_,
    "\n"
    "typedef $classname$_Stub Stub;\n"
    "\n"
    "static const ::google::protobuf::ServiceDescriptor* descriptor();\n"
    "\n");

  GenerateMethodSignatures(VIRTUAL, printer);

  printer->Print(
    "\n"
    "// implements Service ----------------------------------------------\n"
    "\n"
    "const ::google::protobuf::ServiceDescriptor* GetDescriptor();\n"
    "void CallMethod(const ::google::protobuf::MethodDescriptor* method,\n"
    "                ::google::protobuf::RpcController* controller,\n"
    "                const ::google::protobuf::Message* request,\n"
    "                ::google::protobuf::Message* response,\n"
    "                ::google::protobuf::Closure* done);\n"
    "const ::google::protobuf::Message& GetRequestPrototype(\n"
    "  const ::google::protobuf::MethodDescriptor* method) const;\n"
    "const ::google::protobuf::Message& GetResponsePrototype(\n"
    "  const ::google::protobuf::MethodDescriptor* method) const;\n");

  printer->Outdent();
  printer->Print(vars_,
    "\n"
    " private:\n"
    "  GOOGLE_DISALLOW_EVIL_CONSTRUCTORS($classname$);\n"
    "};\n"
    "\n");
}